

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O1

int dividebyN(int N)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = N * -0x73ecade3;
  while (iVar1 + 0x26a439fU < 0x4d4873f) {
    N = N / 0x35;
    iVar1 = N * -0x73ecade3;
  }
  for (; N * 0x677d46cf + 0x2b93105U < 0x572620b; N = N / 0x2f) {
  }
  for (; N * 0x2fa0be83 + 0x2fa0be8U < 0x5f417d1; N = N / 0x2b) {
  }
  for (; N * -0x3e7063e7 + 0x31f3831U < 0x63e7063; N = N / 0x29) {
  }
  for (; N * -0x6eb3e453 + 0x3759f22U < 0x6eb3e45; N = N / 0x25) {
  }
  for (; N * -0x42108421 + 0x4210842U < 0x8421085; N = N / 0x1f) {
  }
  for (; N * 0x4f72c235 + 0x469ee58U < 0x8d3dcb1; N = N / 0x1d) {
  }
  for (; N * -0x1642c859 + 0x590b216U < 0xb21642d; N = N / 0x17) {
  }
  for (; N * -0xf0f0f0f + 0x7878787U < 0xf0f0f0f; N = N / 0x11) {
  }
  for (; N * -0x3b13b13b + 0x9d89d89U < 0x13b13b13; N = N / 0xd) {
  }
  for (; N * -0x45d1745d + 0xba2e8baU < 0x1745d175; N = N / 0xb) {
  }
  do {
    uVar3 = N;
    N = (int)uVar3 >> 3;
  } while ((uVar3 & 7) == 0);
  for (; uVar3 * -0x49249249 + 0x12492492 < 0x24924925; uVar3 = (int)uVar3 / 7) {
  }
  for (; uVar3 * -0x33333333 + 0x19999999 < 0x33333333; uVar3 = (int)uVar3 / 5) {
  }
  do {
    uVar2 = uVar3;
    uVar3 = (int)uVar2 >> 2;
  } while ((uVar2 & 3) == 0);
  for (; uVar2 * -0x55555555 + 0x2aaaaaaa < 0x55555555; uVar2 = (int)uVar2 / 3) {
  }
  do {
    uVar3 = uVar2;
    uVar2 = (int)uVar3 >> 1;
  } while ((uVar3 & 1) == 0);
  return (uint)(uVar3 == 1);
}

Assistant:

int dividebyN(int N) {
	while (N%53 == 0) {
		N = N/53;
	}
	while (N%47 == 0) {
		N = N/47;
	}
	while (N%43 == 0) {
		N = N/43;
	}
	while (N%41 == 0) {
		N = N/41;
	}
	while (N%37 == 0) {
		N = N/37;
	}
	while (N%31 == 0) {
		N = N/31;
	}
	while (N%29 == 0) {
		N = N/29;
	}
	while (N%23 == 0) {
		N = N/23;
	}
	while (N%17 == 0) {
		N = N/17;
	}
	while (N%13 == 0) {
		N = N/13;
	}
	while (N%11 == 0) {
		N = N/11;
	}
	while (N%8 == 0) {
		N = N/8;
	}
	while (N%7 == 0) {
		N = N/7;
	}
	while (N%5 == 0) {
		N = N/5;
	}
	while (N%4 == 0) {
		N = N/4;
	}
	while (N%3 == 0) {
		N = N/3;
	}
	while (N%2 == 0) {
		N = N/2;
	}
	if (N == 1) {
		return 1;
	}
	 return 0;

}